

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O0

ion_err_t linear_hash_destroy(linear_hash_table_t *linear_hash)

{
  int iVar1;
  char local_25 [8];
  char filename [12];
  ion_err_t err;
  linear_hash_table_t *linear_hash_local;
  
  unique0x100000d9 = linear_hash;
  filename[4] = linear_hash_close(linear_hash);
  linear_hash_local._7_1_ = filename[4];
  if (filename[4] == '\0') {
    dictionary_get_filename((stack0xffffffffffffffe8->super).id,"lhs",local_25);
    iVar1 = remove(local_25);
    if (iVar1 == 0) {
      dictionary_get_filename((stack0xffffffffffffffe8->super).id,"lhd",local_25);
      iVar1 = remove(local_25);
      if (iVar1 == 0) {
        linear_hash_local._7_1_ = '\0';
      }
      else {
        linear_hash_local._7_1_ = '\v';
      }
    }
    else {
      linear_hash_local._7_1_ = '\v';
    }
  }
  return linear_hash_local._7_1_;
}

Assistant:

ion_err_t
linear_hash_destroy(
	linear_hash_table_t *linear_hash
) {
	ion_err_t err = linear_hash_close(linear_hash);

	if (err_ok != err) {
		return err;
	}

	char filename[ION_MAX_FILENAME_LENGTH];

	dictionary_get_filename(linear_hash->super.id, "lhs", filename);

	if (0 != fremove(filename)) {
		return err_file_delete_error;
	}

	dictionary_get_filename(linear_hash->super.id, "lhd", filename);

	if (0 != fremove(filename)) {
		return err_file_delete_error;
	}

	return err_ok;
}